

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ref.h
# Opt level: O2

void __thiscall
swutil::SharedPtr<KeyFileReader<NWN::ResRef16>_>::~SharedPtr
          (SharedPtr<KeyFileReader<NWN::ResRef16>_> *this)

{
  int *piVar1;
  
  piVar1 = this->m_SharedState;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (this->m_Ptr != (KeyFileReader<NWN::ResRef16> *)0x0) {
        (*(this->m_Ptr->super_IResourceAccessor<NWN::ResRef32>)._vptr_IResourceAccessor[10])();
      }
      free(this->m_SharedState);
      return;
    }
  }
  return;
}

Assistant:

~SharedPtr()
		{
			if (m_SharedState)
			{
				if (!InterlockedDecrementPtr( m_SharedState ))
				{
					SharedPtrDeleterDelete( m_Ptr );
					SharedPtrDeleteSharedState( m_SharedState );
				}
			}
		}